

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O2

int __thiscall bhf::ads::LicenseAccess::ShowOnlineInfo(LicenseAccess *this,ostream *os)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  uint uVar4;
  size_t length;
  pointer this_00;
  uint32_t bytesRead;
  string local_1f8;
  uint local_1d4;
  vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_> readBuffer;
  stringstream stream;
  ostream local_1a8 [376];
  
  local_1d4 = 0;
  bytesRead = 0;
  lVar2 = AdsDevice::ReadReqEx2(&this->device,0x1010006,0,4,&local_1d4,&bytesRead);
  if (lVar2 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::operator<<(local_1a8,"ShowOnlineInfo");
    poVar3 = std::operator<<(poVar3,"(): read license count failed with: 0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,'\n');
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    return 1;
  }
  if ((ulong)local_1d4 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::operator<<(local_1a8,"ShowOnlineInfo");
    std::operator<<(poVar3,"(): no license available\n");
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    return 0;
  }
  std::vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>::vector
            (&readBuffer,(ulong)local_1d4,(allocator_type *)&stream);
  length = (long)readBuffer.
                 super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
           (long)readBuffer.
                 super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = AdsDevice::ReadReqEx2
                    (&this->device,0x1010006,0,length,
                     readBuffer.
                     super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start,&bytesRead);
  if (lVar2 == 0) {
    if (length == bytesRead) {
      std::operator<<(os,"OrderNo.;Instances;Status;License\n");
      for (this_00 = readBuffer.
                     super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          this_00 !=
          readBuffer.
          super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
        iVar1 = TcLicenseOnlineInfo::ShowOrderNo(this_00,os,&this->device);
        if (iVar1 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&stream);
          poVar3 = std::operator<<(local_1a8,"ShowOnlineInfo");
          poVar3 = std::operator<<(poVar3,"(): reading order number failed with: 0x");
          *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
               *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          std::operator<<(poVar3,'\n');
          std::__cxx11::stringbuf::str();
          Logger::Log(3,&local_1f8);
          goto LAB_001255f9;
        }
        std::operator<<(os,';');
        poVar3 = TcLicenseOnlineInfo::ShowInstances(this_00,os);
        std::operator<<(poVar3,';');
        poVar3 = TcLicenseOnlineInfo::ShowStatus(this_00,os);
        std::operator<<(poVar3,';');
        iVar1 = TcLicenseOnlineInfo::ShowName(this_00,os,&this->device);
        if (iVar1 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&stream);
          poVar3 = std::operator<<(local_1a8,"ShowOnlineInfo");
          poVar3 = std::operator<<(poVar3,"(): reading license name failed with: 0x");
          *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
               *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          std::operator<<(poVar3,'\n');
          std::__cxx11::stringbuf::str();
          Logger::Log(3,&local_1f8);
          goto LAB_001255f9;
        }
        std::operator<<(os,'\n');
      }
      uVar4 = (uint)(*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) != 0);
      goto LAB_00125610;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::operator<<(local_1a8,"ShowOnlineInfo");
    poVar3 = std::operator<<(poVar3,"(): read unexpected number of bytes: 0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", expected: 0x");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,'\n');
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1f8);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::operator<<(local_1a8,"ShowOnlineInfo");
    poVar3 = std::operator<<(poVar3,"(): failed with: 0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,'\n');
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1f8);
  }
LAB_001255f9:
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  uVar4 = 1;
LAB_00125610:
  std::_Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>::
  ~_Vector_base(&readBuffer.
                 super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
               );
  return uVar4;
}

Assistant:

int LicenseAccess::ShowOnlineInfo(std::ostream& os) const
{
    uint32_t licenseCount = 0;
    uint32_t bytesRead = 0;
    const auto countStatus = device.ReadReqEx2(0x01010006,
                                               0x0,
                                               sizeof(licenseCount),
                                               &licenseCount,
                                               &bytesRead);
    if (ADSERR_NOERR != countStatus) {
        LOG_ERROR(__FUNCTION__ << "(): read license count failed with: 0x" << std::hex << countStatus << '\n');
        return 1;
    }

    licenseCount = bhf::ads::letoh(licenseCount);
    if (0 == licenseCount) {
        LOG_WARN(__FUNCTION__ << "(): no license available\n");
        return 0;
    }

    auto readBuffer = std::vector<TcLicenseOnlineInfo>(licenseCount);
    const auto bufferSize = sizeof(readBuffer[0]) * readBuffer.capacity();
    const auto status = device.ReadReqEx2(0x01010006,
                                          0x0,
                                          bufferSize,
                                          readBuffer.data(),
                                          &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return 1;
    }

    if (bufferSize != bytesRead) {
        LOG_ERROR(
            __FUNCTION__ << "(): read unexpected number of bytes: 0x" << std::hex << bytesRead << ", expected: 0x" << readBuffer.capacity() <<
                '\n');
        return 1;
    }

    os << "OrderNo.;Instances;Status;License\n";
    for (const auto& next: readBuffer) {
        if (next.ShowOrderNo(os, device)) {
            LOG_ERROR(__FUNCTION__ << "(): reading order number failed with: 0x" << std::hex << status << '\n');
            return 1;
        }

        os << ';';
        next.ShowInstances(os) << ';';
        next.ShowStatus(os) << ';';
        if (next.ShowName(os, device)) {
            LOG_ERROR(__FUNCTION__ << "(): reading license name failed with: 0x" << std::hex << status << '\n');
            return 1;
        }
        os << '\n';
    }
    return !os.good();
}